

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_fusefref(ASMState *as,IRIns *ir,RegSet allow)

{
  ushort uVar1;
  Reg RVar2;
  byte bVar3;
  
  bVar3 = "\f\b\x10\x10\b\x14\x18\x1c\x06\x10\x06\x18\x06\b\b\b\f"[(ir->field_0).op2];
  (as->mrm).ofs = (uint)bVar3;
  (as->mrm).idx = 0x80;
  uVar1 = (ir->field_0).op1;
  if ((short)uVar1 < 0) {
    bVar3 = *(byte *)((long)as->ir + (ulong)uVar1 * 8 + 6);
    if ((char)bVar3 < '\0') {
      RVar2 = ra_allocref(as,(uint)uVar1,allow);
      bVar3 = (byte)RVar2;
    }
    as->weakset = as->weakset & (-2 << (bVar3 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar3 & 0x1f));
  }
  else {
    (as->mrm).ofs = (uint)bVar3 + as->ir[uVar1].field_1.op12;
    bVar3 = 0x80;
  }
  (as->mrm).base = bVar3;
  return;
}

Assistant:

static void asm_fusefref(ASMState *as, IRIns *ir, RegSet allow)
{
  lua_assert(ir->o == IR_FLOAD || ir->o == IR_FREF);
  as->mrm.ofs = field_ofs[ir->op2];
  as->mrm.idx = RID_NONE;
  if (irref_isk(ir->op1)) {
    as->mrm.ofs += IR(ir->op1)->i;
    as->mrm.base = RID_NONE;
  } else {
    as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
  }
}